

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineOffsetCache.cpp
# Opt level: O3

bool Js::LineOffsetCache::FindNextLine
               (LPCUTF8 *currentSourcePosition,LPCUTF8 sourceEndCharacter,
               charcount_t *inOutCharacterOffset,charcount_t *inOutByteOffset,
               charcount_t maxCharacterOffset)

{
  byte bVar1;
  char16 cVar2;
  LPCUTF8 puVar3;
  charcount_t cVar4;
  int iVar5;
  byte *pbVar6;
  charcount_t cVar7;
  DecodeOptions local_38;
  charcount_t local_34;
  DecodeOptions options;
  
  cVar4 = *inOutCharacterOffset;
  cVar7 = *inOutByteOffset;
  local_38 = doAllowThreeByteSurrogates;
  pbVar6 = *currentSourcePosition;
  local_34 = maxCharacterOffset;
  while( true ) {
    if (sourceEndCharacter <= pbVar6) {
      return false;
    }
    *currentSourcePosition = pbVar6 + 1;
    bVar1 = *pbVar6;
    cVar2 = (char16)bVar1;
    if ((char)bVar1 < '\0') {
      cVar2 = utf8::DecodeTail((ushort)bVar1,currentSourcePosition,sourceEndCharacter,&local_38,
                               (bool *)0x0);
      maxCharacterOffset = local_34;
    }
    iVar5 = (int)pbVar6;
    if (((ushort)cVar2 - 0x2028 < 2) || (cVar2 == L'\n')) break;
    if (cVar2 == L'\r') {
      puVar3 = *currentSourcePosition;
      if (*puVar3 == '\n') {
        puVar3 = puVar3 + 1;
        *currentSourcePosition = puVar3;
        cVar4 = cVar4 + 1;
      }
      goto LAB_007812f1;
    }
    cVar4 = cVar4 + 1;
    pbVar6 = *currentSourcePosition;
    cVar7 = cVar7 + ((int)pbVar6 - iVar5);
    if (maxCharacterOffset <= cVar4) {
      return false;
    }
  }
  puVar3 = *currentSourcePosition;
LAB_007812f1:
  *inOutCharacterOffset = cVar4 + 1;
  *inOutByteOffset = cVar7 + ((int)puVar3 - iVar5);
  return true;
}

Assistant:

bool LineOffsetCache::FindNextLine(_In_z_ LPCUTF8 &currentSourcePosition, _In_z_ LPCUTF8 sourceEndCharacter, charcount_t &inOutCharacterOffset, charcount_t &inOutByteOffset, charcount_t maxCharacterOffset)
    {
        charcount_t currentCharacterOffset = inOutCharacterOffset;
        charcount_t currentByteOffset = inOutByteOffset;
        utf8::DecodeOptions options = utf8::doAllowThreeByteSurrogates;

        while (currentSourcePosition < sourceEndCharacter)
        {
            LPCUTF8 previousCharacter = currentSourcePosition;

            // Decode from UTF8 to wide char.  Note that Decode will advance the current character by 1 at least.
            char16 decodedCharacter = utf8::Decode(currentSourcePosition, sourceEndCharacter, options);

            bool wasLineEncountered = false;
            switch (decodedCharacter)
            {
            case _u('\r'):
                // Check if the next character is a '\n'.  If so, consume that character as well
                // (consider as one line).
                if (*currentSourcePosition == '\n')
                {
                    ++currentSourcePosition;
                    ++currentCharacterOffset;
                }

                // Intentional fall-through.
            case _u('\n'):
            case 0x2028:
            case 0x2029:
                // Found a new line.
                wasLineEncountered = true;
                break;
            }

            // Move to the next character offset.
            ++currentCharacterOffset;

            // Count the current byte offset we're at in the UTF-8 buffer.
            // The character size can be > 1 for unicode characters.
            currentByteOffset += static_cast<int>(currentSourcePosition - previousCharacter);

            if (wasLineEncountered)
            {
                inOutCharacterOffset = currentCharacterOffset;
                inOutByteOffset = currentByteOffset;
                return true;
            }
            else if (currentCharacterOffset >= maxCharacterOffset)
            {
                return false;
            }
        }

        return false;
    }